

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::deleteFixup
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          LinkType nilParent)

{
  byte *pbVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int x_00;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  LinkType x_01;
  
  if (*this->rootNode != x) {
    do {
      x_01 = nilParent;
      if (x != -1) {
        if (*(int *)(*(long *)this[2].rootNode + 0x18 + (long)x * 0x20) < 0) break;
        if (x != -1) {
          x_01 = (*(uint *)(*(long *)this[2].rootNode + 0x18 + (long)x * 0x20) & 0x7fffffff) - 1;
        }
      }
      lVar4 = *(long *)this[2].rootNode;
      lVar9 = (long)x_01 * 0x20;
      iVar3 = *(int *)(lVar4 + 0x10 + lVar9);
      uVar8 = (ulong)(x == iVar3);
      x_00 = *(int *)(lVar4 + lVar9 + 0x10 + uVar8 * 4);
      if (((long)x_00 != -1) && (lVar5 = (long)x_00 * 0x20, *(int *)(lVar4 + 0x18 + lVar5) < 0)) {
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar5);
        *pbVar1 = *pbVar1 & 0x7f;
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar9);
        *pbVar1 = *pbVar1 | 0x80;
        rotate(this,x_01,(uint)(x != iVar3));
        x_00 = *(LinkType *)(*(long *)this[2].rootNode + lVar9 + 0x10 + uVar8 * 4);
      }
      lVar4 = *(long *)this[2].rootNode;
      lVar5 = (long)x_00 * 0x20;
      piVar7 = (int *)(lVar4 + lVar5 + 0x10);
      if ((((long)*piVar7 == -1) || (-1 < *(int *)(lVar4 + 0x18 + (long)*piVar7 * 0x20))) &&
         ((lVar6 = (long)*(int *)(lVar4 + lVar5 + 0x14), lVar6 == -1 ||
          (-1 < *(int *)(lVar4 + 0x18 + lVar6 * 0x20))))) {
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar5);
        *pbVar1 = *pbVar1 | 0x80;
        x = x_01;
      }
      else {
        if (((long)piVar7[uVar8] == -1) ||
           (-1 < *(int *)(lVar4 + 0x18 + (long)piVar7[uVar8] * 0x20))) {
          puVar2 = (uint *)(lVar4 + 0x18 + (long)piVar7[x != iVar3] * 0x20);
          *puVar2 = *puVar2 & 0x7fffffff;
          pbVar1 = (byte *)(lVar4 + 0x1b + lVar5);
          *pbVar1 = *pbVar1 | 0x80;
          rotate(this,x_00,(uint)(x == iVar3));
          x_00 = *(int *)(*(long *)this[2].rootNode + lVar9 + 0x10 + uVar8 * 4);
        }
        lVar4 = *(long *)this[2].rootNode;
        lVar5 = (long)x_00 * 0x20;
        *(uint *)(lVar4 + 0x18 + lVar5) =
             *(uint *)(lVar4 + 0x18 + lVar9) & 0x80000000 |
             *(uint *)(lVar4 + 0x18 + lVar5) & 0x7fffffff;
        pbVar1 = (byte *)(lVar4 + 0x1b + lVar9);
        *pbVar1 = *pbVar1 & 0x7f;
        puVar2 = (uint *)(lVar4 + 0x18 + (long)*(int *)(lVar4 + lVar5 + 0x10 + uVar8 * 4) * 0x20);
        *puVar2 = *puVar2 & 0x7fffffff;
        rotate(this,x_01,(uint)(x != iVar3));
        x = *this->rootNode;
      }
    } while (x != *this->rootNode);
  }
  if (x != -1) {
    puVar2 = (uint *)(*(long *)this[2].rootNode + 0x18 + (long)x * 0x20);
    *puVar2 = *puVar2 & 0x7fffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }